

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

int sha512_process(sha512_state *md,uchar *in,unsigned_long inlen)

{
  ulong uVar1;
  unsigned_long uVar2;
  int iVar3;
  uint uVar4;
  undefined8 in_RAX;
  ulong uVar5;
  ulong uVar6;
  
  iVar3 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),md == (sha512_state *)0x0);
  if ((in != (uchar *)0x0 && md != (sha512_state *)0x0) && (md->curlen < 0x81)) {
    uVar6 = inlen * 8;
    uVar1 = md->length;
    uVar5 = CONCAT71((int7)(uVar1 + uVar6 >> 8),CARRY8(uVar1,uVar6));
    iVar3 = (int)uVar5;
    if ((inlen <= uVar6) && (!CARRY8(uVar1,uVar6))) {
      while (iVar3 = (int)uVar5, inlen != 0) {
        uVar2 = md->curlen;
        if (inlen < 0x80 || uVar2 != 0) {
          uVar6 = 0x80 - uVar2;
          if (inlen < 0x80 - uVar2) {
            uVar6 = inlen;
          }
          memcpy(md->buf + uVar2,in,uVar6);
          uVar5 = md->curlen + uVar6;
          md->curlen = uVar5;
          in = in + uVar6;
          inlen = inlen - uVar6;
          if (uVar5 == 0x80) {
            uVar4 = s_sha512_compress(md,md->buf);
            uVar5 = (ulong)uVar4;
            md->length = md->length + 0x400;
            md->curlen = 0;
          }
        }
        else {
          uVar4 = s_sha512_compress(md,in);
          uVar5 = (ulong)uVar4;
          md->length = md->length + 0x400;
          in = in + 0x80;
          inlen = inlen - 0x80;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int sha512_process(struct sha512_state * md, const unsigned char *in, unsigned long inlen)
{
    unsigned long n;
    int err;
    if (md == NULL) return -1;
    if (in == NULL) return -1;
    if (md->curlen > sizeof(md->buf)) {
        return -1;
    }
    if (((md->length + inlen * 8) < md->length)
        || ((inlen * 8) < inlen)) {
        return -1;
    }
    while (inlen > 0) {
        if (md->curlen == 0 && inlen >= 128) {
            if ((err = s_sha512_compress(md, in)) != 0) {
                return err;
            }
            md->length += 128 * 8;
            in         += 128;
            inlen      -= 128;
        } else {
            n = MIN(inlen, (128 - md->curlen));
            memcpy(md->buf + md->curlen, in, (size_t)n);
            md->curlen += n;
            in         += n;
            inlen      -= n;
            if (md->curlen == 128) {
                if ((err = s_sha512_compress(md, md->buf)) != 0) {
                    return err;
                }
                md->length += 8 * 128;
                md->curlen = 0;
            }
        }
    }
    return 0;
}